

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O3

int32_t __thiscall icu_63::UnicodeString::indexOf(UnicodeString *this,char16_t c,int32_t start)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  int start_00;
  int iVar4;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (start < 0) {
    iVar4 = (this->fUnion).fFields.fLength;
    iVar3 = (int)sVar1 >> 5;
    start_00 = 0;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
    iVar4 = (this->fUnion).fFields.fLength;
    start_00 = iVar3;
    if (sVar1 < 0) {
      start_00 = iVar4;
    }
    if (start <= start_00) {
      start_00 = start;
    }
  }
  if (sVar1 < 0) {
    iVar3 = iVar4;
  }
  iVar2 = doIndexOf(this,c,start_00,iVar3 - start_00);
  return iVar2;
}

Assistant:

inline int32_t
UnicodeString::indexOf(char16_t c,
               int32_t start) const {
  pinIndex(start);
  return doIndexOf(c, start, length() - start);
}